

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
StringInstance::op_substringFromIndex
          (StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  undefined8 *puVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int from_index;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_e0 [24];
  string *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  char in_stack_ffffffffffffff47;
  string *in_stack_ffffffffffffff48;
  string local_a0 [32];
  IntegerInstance local_80;
  int local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  __lhs = in_RDI;
  local_18 = in_RDX;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar3 != 1) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  IntegerInstance::IntegerInstance
            ((IntegerInstance *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  iVar1 = IntegerInstance::value(&local_80);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1bc5e2);
  local_1c = iVar1;
  if (-1 < iVar1) {
    iVar5 = iVar1;
    iVar2 = std::__cxx11::string::size();
    if (iVar1 <= iVar2) {
      std::__cxx11::string::substr((ulong)local_e0,in_RSI + 0x58);
      str_utils::escape(in_stack_ffffffffffffff48,in_stack_ffffffffffffff47);
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar5,iVar1));
      std::operator+(__lhs,(char *)CONCAT44(iVar5,iVar1));
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
      std::__cxx11::string::~string(local_e0);
      return in_RDI;
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_substringFromIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int from_index = IntegerInstance(arguments[0]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    return "\"" + str_utils::escape(_value.substr(from_index), '"') + "\"";
}